

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSNet.h
# Opt level: O0

int recvall(SOCKET sock,char *recvbuf,int recvbuflen)

{
  int iVar1;
  ssize_t sVar2;
  int local_20;
  int Bytes;
  int BytesReceived;
  int recvbuflen_local;
  char *recvbuf_local;
  SOCKET sock_local;
  
  local_20 = 0;
  while( true ) {
    if (recvbuflen <= local_20) {
      return 0;
    }
    sVar2 = recv(sock,recvbuf + local_20,(long)(recvbuflen - local_20),0);
    iVar1 = (int)sVar2;
    if (iVar1 < 0) break;
    if (iVar1 == 0) {
      return 2;
    }
    local_20 = iVar1 + local_20;
  }
  return 1;
}

Assistant:

inline int recvall(SOCKET sock, char* recvbuf, int recvbuflen)
{
#ifdef _DEBUG_MESSAGES_OSNET
	int i = 0;
#endif // _DEBUG_MESSAGES_OSNET
	int BytesReceived = 0;
	int Bytes = 0;

	while (BytesReceived < recvbuflen)
	{
		Bytes = recv(sock, recvbuf + BytesReceived, recvbuflen - BytesReceived, 0);
		if (Bytes >= 0)
		{
			if (Bytes == 0)
			{
				PRINT_DEBUG_WARNING_OSNET(("recvall warning (%s) : %s(sock=%d, recvbuf=%#x, recvbuflen=%d)\n", 
					strtime_m(), 
					szOSUtilsErrMsgs[EXIT_TIMEOUT], 
					(int)sock, recvbuf, recvbuflen));
#ifdef _DEBUG_MESSAGES_OSNET
				for (i = 0; i < BytesReceived; i++)
				{
					PRINT_DEBUG_MESSAGE_OSNET(("%.2x ", (int)(unsigned char)recvbuf[i]));
				}
				PRINT_DEBUG_MESSAGE_OSNET(("\n"));
#endif // _DEBUG_MESSAGES_OSNET
				PRINT_DEBUG_MESSAGE_OSNET(("Total bytes received : %d\n", BytesReceived));
				return EXIT_TIMEOUT;
			}
			else
			{
				PRINT_DEBUG_MESSAGE_OSNET(("Bytes received : %d\n", Bytes));
			}
		}
		else
		{
			PRINT_DEBUG_ERROR_OSNET(("recvall error (%s) : %s(sock=%d, recvbuf=%#x, recvbuflen=%d)\n", 
				strtime_m(), 
				WSAGetLastErrorMsg(), 
				(int)sock, recvbuf, recvbuflen));
#ifdef _DEBUG_MESSAGES_OSNET
			for (i = 0; i < BytesReceived; i++)
			{
				PRINT_DEBUG_MESSAGE_OSNET(("%.2x ", (int)(unsigned char)recvbuf[i]));
			}
			PRINT_DEBUG_MESSAGE_OSNET(("\n"));
#endif // _DEBUG_MESSAGES_OSNET
			PRINT_DEBUG_MESSAGE_OSNET(("Total bytes received : %d\n", BytesReceived));
			return EXIT_FAILURE;
		}

		BytesReceived += Bytes;
	}

#ifdef _DEBUG_MESSAGES_OSNET
	for (i = 0; i < BytesReceived; i++)
	{
		PRINT_DEBUG_MESSAGE_OSNET(("%.2x ", (int)(unsigned char)recvbuf[i]));
	}
	PRINT_DEBUG_MESSAGE_OSNET(("\n"));
#endif // _DEBUG_MESSAGES_OSNET
	PRINT_DEBUG_MESSAGE_OSNET(("Total bytes received : %d\n", BytesReceived));

	return EXIT_SUCCESS;
}